

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O1

char * test_matrix4_determinant_row_is_zero(void)

{
  short sVar1;
  char *pcVar2;
  float fVar3;
  anon_union_64_5_d0a4420b_for_matrix4_0 local_48;
  
  matrix4_identity((matrix4 *)&local_48.field_1);
  fVar3 = matrix4_determinant((matrix4 *)&local_48.field_1);
  sVar1 = scalar_equalsf(fVar3,0.0);
  if (sVar1 == 0) {
    sVar1 = scalar_equalsf(fVar3,1.0);
    if (sVar1 == 0) {
      pcVar2 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(615) : (assertion failed) ((scalar_equalsf(det, 1)))"
      ;
    }
    else {
      matrix4_identity((matrix4 *)&local_48.field_1);
      local_48._0_8_ = 0;
      local_48._8_8_ = 0;
      fVar3 = matrix4_determinant((matrix4 *)&local_48.field_1);
      sVar1 = scalar_equalsf(fVar3,0.0);
      if (sVar1 == 0) {
        pcVar2 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(621) : (assertion failed) ((scalar_equalsf(det, 0)))"
        ;
      }
      else {
        matrix4_identity((matrix4 *)&local_48.field_1);
        local_48._16_8_ = 0;
        local_48._24_8_ = 0;
        fVar3 = matrix4_determinant((matrix4 *)&local_48.field_1);
        sVar1 = scalar_equalsf(fVar3,0.0);
        if (sVar1 == 0) {
          pcVar2 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(626) : (assertion failed) ((scalar_equalsf(det, 0)))"
          ;
        }
        else {
          matrix4_identity((matrix4 *)&local_48.field_1);
          local_48._32_8_ = 0;
          local_48._40_8_ = 0;
          fVar3 = matrix4_determinant((matrix4 *)&local_48.field_1);
          sVar1 = scalar_equalsf(fVar3,0.0);
          if (sVar1 == 0) {
            pcVar2 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(631) : (assertion failed) ((scalar_equalsf(det, 0)))"
            ;
          }
          else {
            matrix4_identity((matrix4 *)&local_48.field_1);
            local_48._48_8_ = 0;
            local_48._56_8_ = 0;
            fVar3 = matrix4_determinant((matrix4 *)&local_48.field_1);
            sVar1 = scalar_equalsf(fVar3,0.0);
            pcVar2 = (char *)0x0;
            if (sVar1 == 0) {
              pcVar2 = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(636) : (assertion failed) ((scalar_equalsf(det, 0)))"
              ;
            }
          }
        }
      }
    }
  }
  else {
    pcVar2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(614) : (assertion failed) ((!scalar_equalsf(det, 0)))"
    ;
  }
  return pcVar2;
}

Assistant:

static char *test_matrix4_determinant_row_is_zero(void)
{
	struct matrix4 m;
	HYP_FLOAT det;

	/* identity is not zero */
	matrix4_identity(&m);
	det = matrix4_determinant(&m);
	test_assert(!scalar_equals(det, 0));
	test_assert(scalar_equals(det, 1));

	/* when any row is zero, the determinant is zero */
	matrix4_identity(&m);
	m.r00 = 0.0; m.r01 = 0.0; m.r02 = 0.0; m.r03 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	matrix4_identity(&m);
	m.r10 = 0.0; m.r11 = 0.0; m.r12 = 0.0; m.r13 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	matrix4_identity(&m);
	m.r20 = 0.0; m.r21 = 0.0; m.r22 = 0.0; m.r23 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	matrix4_identity(&m);
	m.r30 = 0.0; m.r31 = 0.0; m.r32 = 0.0; m.r33 = 0.0;
	det = matrix4_determinant(&m);
	test_assert(scalar_equals(det, 0));

	return NULL;
}